

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O3

CPscl cp_decl_spec(CPState *cp,CPDecl *decl,CPscl scl)

{
  GCstr *pGVar1;
  CTState *cts;
  CType *pCVar2;
  CPState *pCVar3;
  int iVar4;
  CTypeID id;
  uint uVar5;
  CPDeclIdx CVar6;
  uint uVar7;
  CTypeID CVar8;
  uint uVar9;
  ErrMsg em;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  CTInfo CVar13;
  uint uVar14;
  ulong uVar15;
  anon_union_4_2_43a9a9ed_for_CPValue_0 aVar16;
  anon_union_4_2_43a9a9ed_for_CPValue_0 aVar17;
  CPValue k;
  uint local_74;
  uint local_70;
  anon_union_4_2_43a9a9ed_for_CPValue_0 local_6c;
  CTypeID CStack_68;
  CTInfo local_64;
  CPState *local_60;
  CPscl local_54;
  CPDecl *local_50;
  ulong local_48;
  ulong local_40;
  CType *local_38;
  
  decl->cp = cp;
  decl->mode = cp->mode;
  uVar15 = 0;
  decl->attr = 0;
  decl->fattr = 0;
  decl->top = 0;
  decl->pos = 0;
  decl->stack[0].next = 0;
  decl->name = (GCstr *)0x0;
  decl->redir = (GCstr *)0x0;
  local_74 = 0;
  local_60 = cp;
  local_54 = scl;
  local_50 = decl;
  uVar9 = 0;
  while( true ) {
    cp_decl_attributes(cp,decl);
    uVar14 = cp->tok;
    uVar12 = (ulong)uVar14;
    uVar7 = uVar14 - 0x10d;
    uVar11 = uVar12;
    local_70 = local_74;
    if (uVar7 < 0x14) break;
    do {
      uVar14 = (uint)uVar12;
      if (uVar9 != 0 || local_70 != 0) goto LAB_0013a69f;
      CVar8 = 0x10;
      uVar9 = 0;
      local_70 = local_74;
      if ((uVar15 & 0x7a0) != 0) goto LAB_0013a6ad;
      if ((int)uVar14 < 0x127) {
        if (uVar14 != 0x24) {
          if (uVar14 == 0x100) {
            local_70 = cp->ct->info;
            if ((local_70 & 0xf0000000) == 0x70000000) {
              local_70 = local_70 & 0xffff;
              goto LAB_0013a424;
            }
            uVar12 = 0x100;
          }
LAB_0013a685:
          local_70 = 0;
          uVar11 = uVar12;
          goto LAB_0013a6ad;
        }
        local_70 = (cp->val).id;
LAB_0013a424:
        cp_next(cp);
      }
      else if (uVar14 == 0x129) {
        local_70 = cp_struct_name(cp,decl,0x50000001);
        if (cp->tok == 0x7b) {
          local_48 = uVar11;
          local_40 = uVar15;
          cp_next(cp);
          _local_6c = 0x900000000;
          iVar4 = cp->tok;
          local_64 = 0x5002000a;
          uVar9 = 9;
          aVar17.i32 = 0;
          CVar8 = local_70;
          do {
            if (iVar4 != 0x100) {
              cp_err_token(cp,0x100);
            }
            pGVar1 = cp->str;
            if ((cp->val).id != 0) {
              cp_errmsg(cp,0,LJ_ERR_FFI_REDEF,pGVar1 + 1);
            }
            cp_next(cp);
            aVar16 = aVar17;
            if (cp->tok == 0x3d) {
              cp_next(cp);
              cp_expr_kint(cp,(CPValue *)&local_6c);
              aVar16.i32 = local_6c.i32;
              if (CStack_68 == 10) {
                if (local_6c.i32 < 0) {
                  uVar9 = 10;
                  goto LAB_0013a515;
                }
              }
              else if (local_6c.i32 < 0) {
                local_64 = 0x50020009;
              }
              _local_6c = CONCAT44(9,local_6c.i32);
              uVar9 = 9;
            }
LAB_0013a515:
            pCVar3 = local_60;
            id = lj_ctype_new(local_60->cts,&local_38);
            cts = pCVar3->cts;
            cts->tab[CVar8].sib = (CTypeID1)id;
            pGVar1->marked = pGVar1->marked | 0x20;
            (local_38->name).gcptr32 = (uint32_t)pGVar1;
            local_38->info = (uVar9 | 0x2000000) + 0xb0000000;
            aVar17.i32 = aVar16.i32 + 1;
            _local_6c = CONCAT44(CStack_68,aVar17.i32);
            local_38->size = (CTSize)aVar16;
            lj_ctype_addname(cts,local_38,id);
            cp = local_60;
            if (local_60->tok != 0x2c) break;
            cp_next(local_60);
            iVar4 = cp->tok;
            CVar8 = id;
          } while (iVar4 != 0x7d);
          cp_check(cp,0x7d);
          pCVar2 = cp->cts->tab;
          pCVar2[local_70].info = local_64;
          pCVar2[local_70].size = 4;
          uVar11 = local_48;
          uVar15 = local_40;
          decl = local_50;
        }
      }
      else {
        if (uVar14 == 0x128) {
          CVar13 = 0x10800000;
        }
        else {
          if (uVar14 != 0x127) goto LAB_0013a685;
          CVar13 = 0x10000000;
        }
        local_70 = cp_decl_struct(cp,decl,CVar13);
      }
      cp_decl_attributes(cp,decl);
      uVar14 = cp->tok;
      uVar12 = (ulong)uVar14;
      uVar7 = uVar14 - 0x10d;
      uVar9 = 0;
    } while (0x13 < uVar7);
    local_74 = local_70;
    uVar10 = cp->ct->size;
LAB_0013a62c:
    cp = local_60;
    uVar5 = 1 << ((byte)uVar7 & 0x1f);
    uVar15 = (ulong)((uint)uVar15 | (uVar5 & (uint)uVar15) * 2 & 0x40 | 1 << (uVar7 & 0x1f));
    uVar9 = uVar10;
    if (uVar14 < 0x11c) {
      local_70 = local_74;
      if (local_74 != 0) goto LAB_0013a69f;
    }
    else if ((local_54 & uVar5) == 0) {
      em = LJ_ERR_FFI_BADSCL;
LAB_0013a82c:
      cp_errmsg(cp,uVar14,em);
    }
    cp_next(local_60);
  }
  uVar5 = cp->ct->size;
  uVar10 = uVar9;
  if ((uVar5 == 0) || (cp = local_60, uVar10 = uVar5, uVar9 == 0)) goto LAB_0013a62c;
LAB_0013a69f:
  CVar8 = (uVar9 != 4) + 0xf;
  uVar11 = (ulong)uVar14;
LAB_0013a6ad:
  uVar14 = (uint)uVar15;
  if ((uVar14 >> 8 & 1) != 0) {
    local_70 = CVar8;
  }
  if (local_70 != 0) {
    cp_push_type(decl,local_70);
    CVar6 = decl->pos;
    uVar9 = decl->attr;
    goto LAB_0013a7cb;
  }
  if ((uVar15 & 1) != 0) {
    CVar13 = decl->attr & 0x3000000 | 0x40000000;
    uVar7 = 0xffffffff;
    goto LAB_0013a7b5;
  }
  uVar5 = (uVar14 & 0x400) << 0xd;
  if ((uVar15 & 2) == 0) {
    if ((uVar15 & 0x10) == 0) {
      uVar7 = uVar9;
      if ((((uVar15 & 4) == 0) && (uVar7 = 2, -1 < (char)uVar15)) &&
         (uVar7 = 8, (uVar15 & 0x40) == 0)) {
        if ((uVar15 & 0x20) == 0) {
          uVar7 = uVar9;
          if ((uVar9 == 0) && (uVar7 = 4, (uVar15 & 0x600) == 0)) {
            uVar14 = (uint)uVar11;
            em = LJ_ERR_FFI_DECLSPEC;
            goto LAB_0013a82c;
          }
        }
        else {
          uVar5 = uVar5 | 0x400000;
        }
      }
    }
    else {
      uVar7 = 0x10;
      if ((uVar15 & 0x20) == 0) {
        uVar7 = uVar9;
      }
      uVar5 = 0x4000000;
    }
  }
  else {
    if ((uVar15 & 0xfff079f4) != 0) {
      uVar14 = 0;
      em = LJ_ERR_FFI_INVTYPE;
      goto LAB_0013a82c;
    }
    uVar5 = uVar5 | 0x8000000;
    if ((uVar14 >> 9 & 1) == 0) {
      uVar5 = 0x8800000;
    }
    uVar7 = uVar9 + (uVar9 == 0);
  }
  iVar4 = 0x1f;
  if (uVar7 != 0) {
    for (; uVar7 >> iVar4 == 0; iVar4 = iVar4 + -1) {
    }
  }
  CVar13 = (decl->attr & 0x3000000) + uVar5 + iVar4 * 0x10000;
LAB_0013a7b5:
  CVar6 = cp_add(decl,CVar13,uVar7);
  decl->pos = CVar6;
  uVar9 = decl->attr & 0xfcffffff;
  decl->attr = uVar9;
LAB_0013a7cb:
  decl->specpos = CVar6;
  decl->specattr = uVar9;
  decl->specfattr = decl->fattr;
  return uVar14 & 0xf8000;
}

Assistant:

static CPscl cp_decl_spec(CPState *cp, CPDecl *decl, CPscl scl)
{
  uint32_t cds = 0, sz = 0;
  CTypeID tdef = 0;

  decl->cp = cp;
  decl->mode = cp->mode;
  decl->name = NULL;
  decl->redir = NULL;
  decl->attr = 0;
  decl->fattr = 0;
  decl->pos = decl->top = 0;
  decl->stack[0].next = 0;

  for (;;) {  /* Parse basic types. */
    cp_decl_attributes(cp, decl);
    if (cp->tok >= CTOK_FIRSTDECL && cp->tok <= CTOK_LASTDECLFLAG) {
      uint32_t cbit;
      if (cp->ct->size) {
	if (sz) goto end_decl;
	sz = cp->ct->size;
      }
      cbit = (1u << (cp->tok - CTOK_FIRSTDECL));
      cds = cds | cbit | ((cbit & cds & CDF_LONG) << 1);
      if (cp->tok >= CTOK_FIRSTSCL) {
	if (!(scl & cbit)) cp_errmsg(cp, cp->tok, LJ_ERR_FFI_BADSCL);
      } else if (tdef) {
	goto end_decl;
      }
      cp_next(cp);
      continue;
    }
    if (sz || tdef ||
	(cds & (CDF_SHORT|CDF_LONG|CDF_SIGNED|CDF_UNSIGNED|CDF_COMPLEX)))
      break;
    switch (cp->tok) {
    case CTOK_STRUCT:
      tdef = cp_decl_struct(cp, decl, CTINFO(CT_STRUCT, 0));
      continue;
    case CTOK_UNION:
      tdef = cp_decl_struct(cp, decl, CTINFO(CT_STRUCT, CTF_UNION));
      continue;
    case CTOK_ENUM:
      tdef = cp_decl_enum(cp, decl);
      continue;
    case CTOK_IDENT:
      if (ctype_istypedef(cp->ct->info)) {
	tdef = ctype_cid(cp->ct->info);  /* Get typedef. */
	cp_next(cp);
	continue;
      }
      break;
    case '$':
      tdef = cp->val.id;
      cp_next(cp);
      continue;
    default:
      break;
    }
    break;
  }
end_decl:

  if ((cds & CDF_COMPLEX))  /* Use predefined complex types. */
    tdef = sz == 4 ? CTID_COMPLEX_FLOAT : CTID_COMPLEX_DOUBLE;

  if (tdef) {
    cp_push_type(decl, tdef);
  } else if ((cds & CDF_VOID)) {
    cp_push(decl, CTINFO(CT_VOID, (decl->attr & CTF_QUAL)), CTSIZE_INVALID);
    decl->attr &= ~CTF_QUAL;
  } else {
    /* Determine type info and size. */
    CTInfo info = CTINFO(CT_NUM, (cds & CDF_UNSIGNED) ? CTF_UNSIGNED : 0);
    if ((cds & CDF_BOOL)) {
      if ((cds & ~(CDF_SCL|CDF_BOOL|CDF_INT|CDF_SIGNED|CDF_UNSIGNED)))
	cp_errmsg(cp, 0, LJ_ERR_FFI_INVTYPE);
      info |= CTF_BOOL;
      if (!(cds & CDF_SIGNED)) info |= CTF_UNSIGNED;
      if (!sz) {
	sz = 1;
      }
    } else if ((cds & CDF_FP)) {
      info = CTINFO(CT_NUM, CTF_FP);
      if ((cds & CDF_LONG)) sz = sizeof(long double);
    } else if ((cds & CDF_CHAR)) {
      if ((cds & (CDF_CHAR|CDF_SIGNED|CDF_UNSIGNED)) == CDF_CHAR)
	info |= CTF_UCHAR;  /* Handle platforms where char is unsigned. */
    } else if ((cds & CDF_SHORT)) {
      sz = sizeof(short);
    } else if ((cds & CDF_LONGLONG)) {
      sz = 8;
    } else if ((cds & CDF_LONG)) {
      info |= CTF_LONG;
      sz = sizeof(long);
    } else if (!sz) {
      if (!(cds & (CDF_SIGNED|CDF_UNSIGNED)))
	cp_errmsg(cp, cp->tok, LJ_ERR_FFI_DECLSPEC);
      sz = sizeof(int);
    }
    lj_assertCP(sz != 0, "basic ctype with zero size");
    info += CTALIGN(lj_fls(sz));  /* Use natural alignment. */
    info += (decl->attr & CTF_QUAL);  /* Merge qualifiers. */
    cp_push(decl, info, sz);
    decl->attr &= ~CTF_QUAL;
  }
  decl->specpos = decl->pos;
  decl->specattr = decl->attr;
  decl->specfattr = decl->fattr;
  return (cds & CDF_SCL);  /* Return storage class. */
}